

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O1

int WebPWrite16bAsPGM(FILE *fout,WebPDecBuffer *buffer)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  int iVar4;
  uint8_t *__ptr;
  uint uVar5;
  
  iVar4 = 0;
  if ((buffer != (WebPDecBuffer *)0x0 && fout != (FILE *)0x0) &&
     (__ptr = (buffer->u).RGBA.rgba, iVar4 = 0, __ptr != (uint8_t *)0x0)) {
    uVar5 = buffer->height;
    iVar1 = (buffer->u).RGBA.stride;
    uVar2 = buffer->width;
    fprintf((FILE *)fout,"P5\n%u %u\n255\n",(ulong)(uVar2 * 2),(ulong)uVar5);
    iVar4 = 1;
    for (; uVar5 != 0; uVar5 = uVar5 - 1) {
      sVar3 = fwrite(__ptr,(ulong)uVar2,2,(FILE *)fout);
      if (sVar3 != 2) {
        return 0;
      }
      __ptr = __ptr + iVar1;
    }
  }
  return iVar4;
}

Assistant:

int WebPWrite16bAsPGM(FILE* fout, const WebPDecBuffer* const buffer) {
  uint32_t width, height;
  uint8_t* rgba;
  int stride;
  const uint32_t bytes_per_px = 2;
  uint32_t y;

  if (fout == NULL || buffer == NULL) return 0;

  width = buffer->width;
  height = buffer->height;
  rgba = buffer->u.RGBA.rgba;
  stride = buffer->u.RGBA.stride;

  if (rgba == NULL) return 0;

  fprintf(fout, "P5\n%u %u\n255\n", width * bytes_per_px, height);
  for (y = 0; y < height; ++y) {
    if (fwrite(rgba, width, bytes_per_px, fout) != bytes_per_px) {
      return 0;
    }
    rgba += stride;
  }
  return 1;
}